

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_symbol_codec.cpp
# Opt level: O3

bool __thiscall lzham::symbol_codec::assemble_output_buf(symbol_codec *this)

{
  short sVar1;
  output_symbol *poVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  uint num_bits;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  uint i;
  int iVar11;
  
  this->m_total_bits_written = 0;
  if ((this->m_output_syms).m_size != 0) {
    uVar9 = 0;
    uVar10 = 0;
    do {
      poVar2 = (this->m_output_syms).m_p;
      sVar1 = poVar2[uVar9].m_num_bits;
      if (sVar1 == -3) {
        if ((this->m_arith_output_buf).m_size != 0) {
          this->m_arith_value = 0;
          this->m_arith_length = 0xffffffff;
          iVar11 = 0;
          do {
            uVar4 = (uint)(this->m_arith_output_buf).m_p[uVar10 + iVar11];
            this->m_arith_value = this->m_arith_value << 8 | uVar4;
            bVar3 = put_bits(this,uVar4,8);
            if (!bVar3) {
              return false;
            }
            iVar11 = iVar11 + 1;
          } while (iVar11 != 4);
          uVar10 = uVar10 + 4;
        }
      }
      else if (sVar1 == -1) {
        uVar4 = this->m_arith_length;
        if (uVar4 < 0x1000000) {
          do {
            uVar8 = 0;
            if (uVar10 < (this->m_arith_output_buf).m_size) {
              uVar6 = (ulong)uVar10;
              uVar10 = uVar10 + 1;
              uVar8 = (uint)(this->m_arith_output_buf).m_p[uVar6];
            }
            bVar3 = put_bits(this,uVar8,8);
            if (!bVar3) {
              return false;
            }
            uVar5 = this->m_arith_value << 8 | uVar8;
            this->m_arith_value = uVar5;
            uVar4 = this->m_arith_length << 8;
            this->m_arith_length = uVar4;
          } while (uVar4 < 0x1000000);
        }
        else {
          uVar5 = this->m_arith_value;
        }
        uVar7 = (uVar4 >> 0xb) * (uint)poVar2[uVar9].m_arith_prob0;
        bVar3 = uVar7 <= uVar5;
        if (bVar3) {
          this->m_arith_value = uVar5 - uVar7;
          uVar7 = uVar4 - uVar7;
        }
        this->m_arith_length = uVar7;
        if (poVar2[uVar9].m_bits != (uint)bVar3) {
          lzham_assert("bit == sym.m_bits",
                       "/workspace/llm4binary/github/license_c_cmakelists/richgel999[P]lzham_codec_devel/lzhamdecomp/lzham_symbol_codec.cpp"
                       ,0x49c);
        }
      }
      else {
        if (sVar1 == -2) {
          uVar4 = -this->m_bit_count & 7;
          if (uVar4 == 0) goto LAB_0011596a;
          num_bits = 8 - uVar4;
          uVar8 = 0;
        }
        else {
          num_bits = (uint)sVar1;
          uVar8 = poVar2[uVar9].m_bits;
        }
        bVar3 = put_bits(this,uVar8,num_bits);
        if (!bVar3) {
          return false;
        }
      }
LAB_0011596a:
      uVar9 = uVar9 + 1;
    } while (uVar9 < (this->m_output_syms).m_size);
  }
  bVar3 = put_bits(this,0,7);
  return bVar3;
}

Assistant:

bool symbol_codec::assemble_output_buf()
   {
      m_total_bits_written = 0;

      uint arith_buf_ofs = 0;

      // Intermix the final Arithmetic, Huffman, or plain bits to a single combined bitstream.
      // All bits from each source must be output in exactly the same order that the decompressor will read them.
      for (uint sym_index = 0; sym_index < m_output_syms.size(); sym_index++)
      {
         const output_symbol& sym = m_output_syms[sym_index];

         if (sym.m_num_bits == output_symbol::cAlignToByteSym)
         {
            if (!put_bits_align_to_byte())
            {
               LZHAM_LOG_ERROR(4026);
               return false;
            }
         }
         else if (sym.m_num_bits == output_symbol::cArithInit)
         {
            LZHAM_ASSERT(m_arith_output_buf.size());

            if (m_arith_output_buf.size())
            {
               m_arith_length = cSymbolCodecArithMaxLen;
               m_arith_value = 0;
               for (uint i = 0; i < 4; i++)
               {
                  const uint c = m_arith_output_buf[arith_buf_ofs++];
                  m_arith_value = (m_arith_value << 8) | c;
                  if (!put_bits(c, 8))
                  {
                     LZHAM_LOG_ERROR(4027);
                     return false;
                  }
               }
            }
         }
         else if (sym.m_num_bits == output_symbol::cArithSym)
         {
            // This renorm logic must match the logic used in the arithmetic decoder.
            if (m_arith_length < cSymbolCodecArithMinLen)
            {
               do
               {
                  const uint c = (arith_buf_ofs < m_arith_output_buf.size()) ? m_arith_output_buf[arith_buf_ofs++] : 0;
                  if (!put_bits(c, 8))
                  {
                     LZHAM_LOG_ERROR(4028);
                     return false;
                  }
                  m_arith_value = (m_arith_value << 8) | c;
               } while ((m_arith_length <<= 8) < cSymbolCodecArithMinLen);
            }

            uint x = sym.m_arith_prob0 * (m_arith_length >> cSymbolCodecArithProbBits);
            uint bit = (m_arith_value >= x);

            if (bit == 0)
            {
               m_arith_length = x;
            }
            else
            {
               m_arith_value  -= x;
               m_arith_length -= x;
            }

            LZHAM_VERIFY(bit == sym.m_bits);
         }
         else
         {
            // Huffman or plain bits
            if (!put_bits(sym.m_bits, sym.m_num_bits))
            {
               LZHAM_LOG_ERROR(4029);
               return false;
            }
         }
      }

      return flush_bits();
   }